

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile.cc
# Opt level: O0

void __thiscall brown::Tile::drawcirc(Tile *this,int xc,int yc,int r,uint32_t col)

{
  int iVar1;
  undefined4 local_2c;
  undefined4 local_28;
  int d;
  int y;
  int x;
  uint32_t col_local;
  int r_local;
  int yc_local;
  int xc_local;
  Tile *this_local;
  
  d = 0;
  local_2c = 1 - r;
  local_28 = r;
  while( true ) {
    drawpix(this,xc + d,yc + local_28,col);
    drawpix(this,xc + local_28,yc + d,col);
    drawpix(this,xc + local_28,yc - d,col);
    drawpix(this,xc + d,yc - local_28,col);
    drawpix(this,xc - d,yc + local_28,col);
    drawpix(this,xc - local_28,yc + d,col);
    drawpix(this,xc - local_28,yc - d,col);
    drawpix(this,xc - d,yc - local_28,col);
    if (local_28 <= d) break;
    if (local_2c < 0) {
      iVar1 = d * 2 + 3;
    }
    else {
      iVar1 = (d - local_28) * 2 + 5;
      local_28 = local_28 + -1;
    }
    local_2c = iVar1 + local_2c;
    d = d + 1;
  }
  return;
}

Assistant:

void Tile::drawcirc (int xc, int yc, int r, std::uint32_t col)
{
    int x, y, d;
    for(x=0,y=r,d=1-r;1;x++)
    {
        this->drawpix(xc+x,yc+y,col); this->drawpix(xc+y,yc+x,col);
        this->drawpix(xc+y,yc-x,col); this->drawpix(xc+x,yc-y,col);
        this->drawpix(xc-x,yc+y,col); this->drawpix(xc-y,yc+x,col);
        this->drawpix(xc-y,yc-x,col); this->drawpix(xc-x,yc-y,col);
        if (x >= y) break;
        if (d < 0) { d += ( x   <<1)+3; } else
                      { d += ((x-y)<<1)+5; y--; }
    }
}